

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DataBlobImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DataBlobImpl> *this,DataBlobImpl *pObj)

{
  DataBlobImpl *pObj_local;
  RefCntAutoPtr<Diligent::DataBlobImpl> *this_local;
  
  this->m_pObject = pObj;
  if (this->m_pObject != (DataBlobImpl *)0x0) {
    RefCountedObject<Diligent::IDataBlob>::AddRef
              ((RefCountedObject<Diligent::IDataBlob> *)this->m_pObject);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }